

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSat.c
# Opt level: O0

DdNode * Cudd_LargestCube(DdManager *manager,DdNode *f,int *length)

{
  ulong uVar1;
  int iVar2;
  DdHalfWord local_50;
  int cost;
  int complement;
  cuddPathPair *rootPair;
  DdNode *sol;
  st__table *visited;
  DdNode *F;
  int *length_local;
  DdNode *f_local;
  DdManager *manager_local;
  
  one = manager->one;
  zero = manager->zero;
  if ((f == (DdNode *)((ulong)one ^ 1)) ||
     (F = (DdNode *)length, length_local = (int *)f, f_local = &manager->sentinel, f == zero)) {
    *length = 1000000;
    manager_local = (DdManager *)((ulong)one ^ 1);
  }
  else {
    do {
      *(undefined4 *)&f_local[0xb].next = 0;
      sol = (DdNode *)st__init_table(st__ptrcmp,st__ptrhash);
      getLargest((DdNode *)length_local,(st__table *)sol);
      uVar1 = (ulong)length_local & 1;
      visited = (st__table *)((ulong)length_local & 0xfffffffffffffffe);
      iVar2 = st__lookup((st__table *)sol,(char *)visited,(char **)&cost);
      if (iVar2 == 0) {
        return (DdNode *)0x0;
      }
      if (uVar1 == 0) {
        local_50 = *_cost;
      }
      else {
        local_50 = _cost[1];
      }
      rootPair = (cuddPathPair *)
                 getCube((DdManager *)f_local,(st__table *)sol,(DdNode *)length_local,local_50);
      st__foreach((st__table *)sol,freePathPair,(char *)0x0);
      st__free_table((st__table *)sol);
    } while (*(int *)&f_local[0xb].next == 1);
    F->index = local_50;
    manager_local = (DdManager *)rootPair;
  }
  return &manager_local->sentinel;
}

Assistant:

DdNode *
Cudd_LargestCube(
  DdManager * manager,
  DdNode * f,
  int * length)
{
    register    DdNode  *F;
    st__table    *visited;
    DdNode      *sol;
    cuddPathPair *rootPair;
    int         complement, cost;

    one = DD_ONE(manager);
    zero = DD_ZERO(manager);

    if (f == Cudd_Not(one) || f == zero) {
        *length = DD_BIGGY;
        return(Cudd_Not(one));
    }
    /* From this point on, a path exists. */

    do {
        manager->reordered = 0;

        /* Initialize visited table. */
        visited = st__init_table( st__ptrcmp, st__ptrhash);

        /* Now get the length of the shortest path(s) from f to 1. */
        (void) getLargest(f, visited);

        complement = Cudd_IsComplement(f);

        F = Cudd_Regular(f);

        if (! st__lookup(visited, (const char *)F, (char **)&rootPair)) return(NULL);

        if (complement) {
          cost = rootPair->neg;
        } else {
          cost = rootPair->pos;
        }

        /* Recover an actual shortest path. */
        sol = getCube(manager,visited,f,cost);

        st__foreach(visited, freePathPair, NULL);
        st__free_table(visited);

    } while (manager->reordered == 1);

    *length = cost;
    return(sol);

}